

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_ManPrintResults(Gia_Man_t *p,sat_solver *pSat,int nIter,abctime clk)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  FILE *pTable;
  abctime clk_local;
  int nIter_local;
  sat_solver *pSat_local;
  Gia_Man_t *p_local;
  
  __stream = fopen("fault_stats.txt","a+");
  pcVar2 = Gia_ManName(p);
  fprintf(__stream,"%s ",pcVar2);
  uVar1 = Gia_ManPiNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = Gia_ManPoNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = Gia_ManRegNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = Gia_ManAndNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = sat_solver_nvars(pSat);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = sat_solver_nclauses(pSat);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = sat_solver_nconflicts(pSat);
  fprintf(__stream,"%d ",(ulong)uVar1);
  fprintf(__stream,"%d ",(ulong)(uint)nIter);
  fprintf(__stream,"%.2f",((double)clk * 1.0) / 1000000.0);
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManPrintResults( Gia_Man_t * p, sat_solver * pSat, int nIter, abctime clk )
{
    FILE * pTable = fopen( "fault_stats.txt", "a+" );

    fprintf( pTable, "%s ", Gia_ManName(p) );
    fprintf( pTable, "%d ", Gia_ManPiNum(p) );
    fprintf( pTable, "%d ", Gia_ManPoNum(p) );
    fprintf( pTable, "%d ", Gia_ManRegNum(p) );
    fprintf( pTable, "%d ", Gia_ManAndNum(p) );

    fprintf( pTable, "%d ", sat_solver_nvars(pSat) );
    fprintf( pTable, "%d ", sat_solver_nclauses(pSat) );
    fprintf( pTable, "%d ", sat_solver_nconflicts(pSat) );

    fprintf( pTable, "%d ", nIter );
    fprintf( pTable, "%.2f", 1.0*clk/CLOCKS_PER_SEC );
    fprintf( pTable, "\n" );
    fclose( pTable );
}